

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIff.c
# Opt level: O2

Iff_Man_t * Gia_ManIffStart(Gia_Man_t *pGia)

{
  int nSize;
  int iVar1;
  Iff_Man_t *pIVar2;
  Vec_Flt_t *pVVar3;
  float *__s;
  Vec_Int_t *pVVar4;
  
  pIVar2 = (Iff_Man_t *)calloc(1,0x40);
  nSize = pGia->nObjs;
  pVVar3 = (Vec_Flt_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nSize - 1U) {
    iVar1 = nSize;
  }
  pVVar3->nCap = iVar1;
  if (iVar1 == 0) {
    __s = (float *)0x0;
  }
  else {
    __s = (float *)malloc((long)iVar1 << 2);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = nSize;
  memset(__s,0xff,(long)nSize << 2);
  pIVar2->vTimes = pVVar3;
  pVVar4 = Vec_IntStartFull(nSize);
  pIVar2->vMatch[2] = pVVar4;
  pVVar4 = Vec_IntStartFull(pGia->nObjs);
  pIVar2->vMatch[3] = pVVar4;
  return pIVar2;
}

Assistant:

Iff_Man_t * Gia_ManIffStart( Gia_Man_t * pGia )
{
    Iff_Man_t * p = ABC_CALLOC( Iff_Man_t, 1 );
    p->vTimes    = Vec_FltStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[2] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    p->vMatch[3] = Vec_IntStartFull( Gia_ManObjNum(pGia) );
    return p;
}